

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O1

Status * __thiscall
draco::PlyDecoder::DecodeInternal(Status *__return_storage_ptr__,PlyDecoder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  Mesh *pMVar5;
  int iVar6;
  const_iterator cVar7;
  PlyElement *pPVar8;
  Status *_local_status;
  PlyReader ply_reader;
  key_type local_98;
  PlyReader local_78;
  
  PlyReader::PlyReader(&local_78);
  PlyReader::Read(__return_storage_ptr__,&local_78,&this->buffer_);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar4 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    psVar2 = &__return_storage_ptr__->error_msg_;
    if (this->out_mesh_ != (Mesh *)0x0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"face","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_78.element_index_._M_t,&local_98);
      if ((_Rb_tree_header *)cVar7._M_node ==
          &local_78.element_index_._M_t._M_impl.super__Rb_tree_header) {
        pPVar8 = (PlyElement *)0x0;
      }
      else {
        pPVar8 = local_78.elements_.
                 super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)cVar7._M_node[2]._M_color;
      }
      DecodeFaceData(__return_storage_ptr__,this,pPVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (__return_storage_ptr__->code_ != OK) goto LAB_00113a1f;
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
    }
    paVar3 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"vertex","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&local_78.element_index_._M_t,&local_98);
    if ((_Rb_tree_header *)cVar7._M_node ==
        &local_78.element_index_._M_t._M_impl.super__Rb_tree_header) {
      pPVar8 = (PlyElement *)0x0;
    }
    else {
      pPVar8 = local_78.elements_.
               super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
               super__Vector_impl_data._M_start + (int)cVar7._M_node[2]._M_color;
    }
    DecodeVertexData(__return_storage_ptr__,this,pPVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar3) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (__return_storage_ptr__->code_ == OK) {
      pcVar4 = (psVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      pMVar5 = this->out_mesh_;
      if ((pMVar5 != (Mesh *)0x0) &&
         ((int)((ulong)((long)(pMVar5->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pMVar5->faces_).vector_.
                             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0)) {
        iVar6 = (*this->out_point_cloud_->_vptr_PointCloud[4])();
        if ((char)iVar6 == '\0') {
          local_98._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Could not deduplicate attribute values","");
          __return_storage_ptr__->code_ = DRACO_ERROR;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar2,local_98._M_dataplus._M_p,
                     local_98._M_dataplus._M_p + local_98._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar3) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00113a1f;
        }
        (*this->out_point_cloud_->_vptr_PointCloud[5])();
      }
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    }
  }
LAB_00113a1f:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_78.element_index_._M_t);
  std::vector<draco::PlyElement,_std::allocator<draco::PlyElement>_>::~vector(&local_78.elements_);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeInternal() {
  PlyReader ply_reader;
  DRACO_RETURN_IF_ERROR(ply_reader.Read(buffer()));
  // First, decode the connectivity data.
  if (out_mesh_)
    DRACO_RETURN_IF_ERROR(DecodeFaceData(ply_reader.GetElementByName("face")));
  // Decode all attributes.
  DRACO_RETURN_IF_ERROR(
      DecodeVertexData(ply_reader.GetElementByName("vertex")));
  // In case there are no faces this is just a point cloud which does
  // not require deduplication.
  if (out_mesh_ && out_mesh_->num_faces() != 0) {
#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
    if (!out_point_cloud_->DeduplicateAttributeValues()) {
      return Status(Status::DRACO_ERROR,
                    "Could not deduplicate attribute values");
    }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
    out_point_cloud_->DeduplicatePointIds();
#endif
  }
  return OkStatus();
}